

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_wrapper.hpp
# Opt level: O0

void __thiscall duckdb::MiniZStream::~MiniZStream(MiniZStream *this)

{
  mz_stream_s *in_RDI;
  
  if (*(int *)&in_RDI[1].next_in == 1) {
    duckdb_miniz::mz_inflateEnd(in_RDI);
  }
  else if (*(int *)&in_RDI[1].next_in == 2) {
    duckdb_miniz::mz_deflateEnd(in_RDI);
  }
  return;
}

Assistant:

~MiniZStream() {
		switch (type) {
		case MiniZStreamType::MINIZ_TYPE_INFLATE:
			duckdb_miniz::mz_inflateEnd(&stream);
			break;
		case MiniZStreamType::MINIZ_TYPE_DEFLATE:
			duckdb_miniz::mz_deflateEnd(&stream);
			break;
		default:
			break;
		}
	}